

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATrie.cpp
# Opt level: O0

int __thiscall DNANode::remove(DNANode *this,char *__filename)

{
  uint uVar1;
  long in_RDX;
  DNANode *nextNode;
  size_t size_local;
  Base *dna_local;
  DNANode *this_local;
  
  if (in_RDX == 0) {
    this->count = -1;
  }
  else {
    this = this->childNodes[*(uint *)__filename];
    if (this != (DNANode *)0x0) {
      uVar1 = remove(this,__filename + 4);
      this = (DNANode *)(ulong)uVar1;
    }
  }
  return (int)this;
}

Assistant:

void DNANode::remove(const DNA::Base* dna, size_t size)
{
    if (!size) {
        count = -1;
        return;
    }
    DNANode* nextNode = childNodes[*dna];
    if (nextNode != nullptr)
        nextNode->remove(dna + 1, size - 1);
}